

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void player_init(player *p)

{
  bitflag *pbVar1;
  ushort uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  monster_race *pmVar9;
  _Bool _Var10;
  angband_constants *paVar11;
  monster_lore *pmVar12;
  player_upkeep *ppVar13;
  object **ppoVar14;
  int16_t *piVar15;
  object *poVar16;
  curse_data *pcVar17;
  player_shape *ppVar18;
  _Bool *p_Var19;
  long lVar20;
  ulong uVar21;
  player_options opts_save;
  
  uVar3 = *(undefined8 *)(p->opts).opt;
  uVar4 = *(undefined8 *)((p->opts).opt + 8);
  uVar5 = *(undefined8 *)((p->opts).opt + 0x10);
  uVar6 = *(undefined8 *)((p->opts).opt + 0x18);
  uVar7 = *(undefined8 *)((p->opts).opt + 0x20);
  uVar8 = *(undefined8 *)((p->opts).opt + 0x28);
  player_cleanup_members(p);
  lVar20 = 0;
  memset(p,0,0x4c8);
  for (uVar21 = 0; (z_info != (angband_constants *)0x0 && (uVar21 < z_info->a_max));
      uVar21 = uVar21 + 1) {
    mark_artifact_created((artifact *)(a_info->flags + lVar20 + -0x3c),false);
    mark_artifact_seen((artifact *)(a_info->flags + lVar20 + -0x3c),false);
    lVar20 = lVar20 + 0x140;
  }
  quests_reset();
  paVar11 = z_info;
  if (z_info != (angband_constants *)0x0) {
    uVar2 = z_info->k_max;
    p_Var19 = &k_info[1].tried;
    for (uVar21 = 1; uVar21 < uVar2; uVar21 = uVar21 + 1) {
      *(undefined2 *)(p_Var19 + -1) = 0;
      p_Var19 = p_Var19 + 0x2c0;
    }
  }
  lVar20 = 0xd0;
  for (uVar21 = 1;
      (pmVar9 = r_info, paVar11 != (angband_constants *)0x0 && (uVar21 < paVar11->r_max));
      uVar21 = uVar21 + 1) {
    pmVar12 = get_lore((monster_race *)(r_info->flags + lVar20 + -0x5c));
    pbVar1 = pmVar9->spell_flags + lVar20 + 0x2c;
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pmVar9->spell_flags[lVar20 + 0x28] = 'd';
    _Var10 = flag_has_dbg(pmVar9->flags + lVar20,0xc,1,"race->flags","RF_UNIQUE");
    if (_Var10) {
      pmVar9->spell_flags[lVar20 + 0x28] = '\x01';
    }
    pmVar12->pkills = 0;
    pmVar12->thefts = 0;
    lVar20 = lVar20 + 0xd0;
    paVar11 = z_info;
  }
  ppVar13 = (player_upkeep *)mem_zalloc(0x98);
  p->upkeep = ppVar13;
  ppoVar14 = (object **)mem_zalloc((ulong)z_info->pack_size * 8 + 8);
  p->upkeep->inven = ppoVar14;
  ppoVar14 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  p->upkeep->quiver = ppoVar14;
  piVar15 = (int16_t *)mem_zalloc(0x6a);
  p->timed = piVar15;
  poVar16 = (object *)mem_zalloc(0x148);
  p->obj_k = poVar16;
  p_Var19 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  p->obj_k->brands = p_Var19;
  p_Var19 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
  p->obj_k->slays = p_Var19;
  pcVar17 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
  p->obj_k->curses = pcVar17;
  *(undefined8 *)((p->opts).opt + 0x20) = uVar7;
  *(undefined8 *)((p->opts).opt + 0x28) = uVar8;
  *(undefined8 *)((p->opts).opt + 0x10) = uVar5;
  *(undefined8 *)((p->opts).opt + 0x18) = uVar6;
  *(undefined8 *)(p->opts).opt = uVar3;
  *(undefined8 *)((p->opts).opt + 8) = uVar4;
  turn = 1;
  p->total_energy = 0;
  p->resting_turn = 0;
  p->race = races;
  p->class = classes;
  ppVar18 = lookup_player_shape("normal");
  p->shape = ppVar18;
  return;
}

Assistant:

void player_init(struct player *p)
{
	int i;
	struct player_options opts_save = p->opts;

	player_cleanup_members(p);

	/* Wipe the player */
	memset(p, 0, sizeof(struct player));

	/* Start with no artifacts made yet */
	for (i = 0; z_info && i < z_info->a_max; i++) {
		mark_artifact_created(&a_info[i], false);
		mark_artifact_seen(&a_info[i], false);
	}

	/* Start with no quests completed */
	quests_reset();

	for (i = 1; z_info && i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		kind->tried = false;
		kind->aware = false;
	}

	for (i = 1; z_info && i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_lore *lore = get_lore(race);
		race->cur_num = 0;
		race->max_num = 100;
		if (rf_has(race->flags, RF_UNIQUE))
			race->max_num = 1;
		lore->pkills = 0;
		lore->thefts = 0;
	}

	p->upkeep = mem_zalloc(sizeof(struct player_upkeep));
	p->upkeep->inven = mem_zalloc((z_info->pack_size + 1) *
								  sizeof(struct object *));
	p->upkeep->quiver = mem_zalloc(z_info->quiver_size *
								   sizeof(struct object *));
	p->timed = mem_zalloc(TMD_MAX * sizeof(int16_t));
	p->obj_k = mem_zalloc(sizeof(struct object));
	p->obj_k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	p->obj_k->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	p->obj_k->curses = mem_zalloc(z_info->curse_max *
								  sizeof(struct curse_data));

	/* Options should persist */
	p->opts = opts_save;

	/* First turn. */
	turn = 1;
	p->total_energy = 0;
	p->resting_turn = 0;

	/* Default to the first race/class in the edit file */
	p->race = races;
	p->class = classes;

	/* Player starts unshapechanged */
	p->shape = lookup_player_shape("normal");
}